

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
b_array::
Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
::Array(Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
        *this,size_t size)

{
  undefined1 auVar1 [16];
  size_t *psVar2;
  long lVar3;
  ulong uVar4;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  local_70;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  this->data = (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                *)0x0;
  this->capacity = size;
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x60),8) == 0) {
    uVar4 = SUB168(auVar1 * ZEXT816(0x60),0) | 8;
  }
  psVar2 = (size_t *)operator_new__(uVar4);
  *psVar2 = size;
  if (size != 0) {
    lVar3 = 0;
    this_00 = (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
               *)(psVar2 + 1);
    do {
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
      ::BPlusTree(&local_70,true);
      Map::
      Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
      ::Pair(this_00,&local_90,
             (MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
              *)&local_70);
      BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
      ::~BPlusTree(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      lVar3 = lVar3 + -0x60;
      this_00 = this_00 + 1;
    } while (-lVar3 != size * 0x60);
  }
  this->data = (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                *)(psVar2 + 1);
  return;
}

Assistant:

Array<T>::Array(size_t size) {
    capacity = size;
    data = new T[capacity]();
}